

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_compile.cpp
# Opt level: O3

PSymbolConst * __thiscall ZCCCompiler::CompileConstant(ZCCCompiler *this,ZCC_ConstantDef *def)

{
  ZCC_TreeNode *pZVar1;
  ENamedName EVar2;
  undefined4 uVar3;
  PType *pPVar4;
  PClass *pPVar5;
  PErrorType *pPVar6;
  int iVar7;
  ZCC_Expression *node;
  undefined4 extraout_var;
  PClass *pPVar9;
  PSymbolConstString *this_00;
  char *msg;
  FName local_34;
  PClass *pPVar8;
  undefined4 extraout_var_00;
  
  if (def->Symbol != (PSymbolConst *)0x0) {
    __assert_fail("def->Symbol == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/zcc_compile.cpp"
                  ,0xbb,"PSymbolConst *ZCCCompiler::CompileConstant(ZCC_ConstantDef *)");
  }
  def->Symbol = (PSymbolConst *)0x1;
  node = Simplify(this,def->Value);
  def->Value = node;
  pPVar9 = PInt::RegistrationInfo.MyClass;
  if ((node->super_ZCC_TreeNode).NodeType == AST_ExprConstant) {
    pPVar4 = node->Type;
    if (pPVar4 == (PType *)TypeString) {
      this_00 = (PSymbolConstString *)
                M_Malloc_Dbg(0x38,
                             "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./dobject.h"
                             ,0x1f7);
      local_34.Index = (def->super_ZCC_NamedNode).NodeName;
      PSymbolConstString::PSymbolConstString
                (this_00,&local_34,(FString *)node[1].super_ZCC_TreeNode.SiblingNext);
      goto LAB_006c8011;
    }
    pPVar8 = (((PBasicType *)&pPVar4->super_DObject)->super_PType).super_DObject.Class;
    if (pPVar8 == (PClass *)0x0) {
      iVar7 = (**(((PBasicType *)&pPVar4->super_DObject)->super_PType).super_DObject._vptr_DObject)
                        (pPVar4);
      pPVar8 = (PClass *)CONCAT44(extraout_var,iVar7);
      (((PBasicType *)&pPVar4->super_DObject)->super_PType).super_DObject.Class = pPVar8;
    }
    pPVar5 = PFloat::RegistrationInfo.MyClass;
    if (pPVar8 == pPVar9) {
      this_00 = (PSymbolConstString *)
                M_Malloc_Dbg(0x38,
                             "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./dobject.h"
                             ,0x1f7);
      EVar2 = (def->super_ZCC_NamedNode).NodeName;
      pPVar4 = node->Type;
      uVar3 = *(undefined4 *)&node[1].super_ZCC_TreeNode.SiblingNext;
      DObject::DObject((DObject *)this_00);
      *(ENamedName *)&(this_00->super_PSymbolConst).super_PSymbol.super_DObject.field_0x24 = EVar2;
      (this_00->super_PSymbolConst).ValueType = pPVar4;
      (this_00->super_PSymbolConst).super_PSymbol.super_DObject._vptr_DObject =
           (_func_int **)&PTR_StaticType_0086e9a0;
      *(undefined4 *)&(this_00->Str).Chars = uVar3;
      goto LAB_006c8011;
    }
    pPVar4 = node->Type;
    pPVar9 = (pPVar4->super_DObject).Class;
    if (pPVar9 == (PClass *)0x0) {
      iVar7 = (**(pPVar4->super_DObject)._vptr_DObject)(pPVar4);
      pPVar9 = (PClass *)CONCAT44(extraout_var_00,iVar7);
      (pPVar4->super_DObject).Class = pPVar9;
    }
    if (pPVar9 == pPVar5) {
      this_00 = (PSymbolConstString *)
                M_Malloc_Dbg(0x38,
                             "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./dobject.h"
                             ,0x1f7);
      EVar2 = (def->super_ZCC_NamedNode).NodeName;
      pPVar4 = node->Type;
      pZVar1 = node[1].super_ZCC_TreeNode.SiblingNext;
      DObject::DObject((DObject *)this_00);
      *(ENamedName *)&(this_00->super_PSymbolConst).super_PSymbol.super_DObject.field_0x24 = EVar2;
      (this_00->super_PSymbolConst).ValueType = pPVar4;
      (this_00->super_PSymbolConst).super_PSymbol.super_DObject._vptr_DObject =
           (_func_int **)&PTR_StaticType_0086e9a0;
      (this_00->Str).Chars = (char *)pZVar1;
      goto LAB_006c8011;
    }
    node = def->Value;
    msg = "Bad type for constant definiton";
  }
  else {
    msg = "Constant definition requires a constant value";
  }
  Error(this,&node->super_ZCC_TreeNode,msg);
  this_00 = (PSymbolConstString *)
            M_Malloc_Dbg(0x38,
                         "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./dobject.h"
                         ,0x1f7);
  pPVar6 = TypeError;
  EVar2 = (def->super_ZCC_NamedNode).NodeName;
  DObject::DObject((DObject *)this_00);
  *(ENamedName *)&(this_00->super_PSymbolConst).super_PSymbol.super_DObject.field_0x24 = EVar2;
  (this_00->super_PSymbolConst).ValueType = &pPVar6->super_PType;
  (this_00->super_PSymbolConst).super_PSymbol.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_0086e9a0;
  *(undefined4 *)&(this_00->Str).Chars = 0;
LAB_006c8011:
  def->Symbol = &this_00->super_PSymbolConst;
  PSymbolTable::ReplaceSymbol(this->Symbols,(PSymbol *)this_00);
  return &this_00->super_PSymbolConst;
}

Assistant:

PSymbolConst *ZCCCompiler::CompileConstant(ZCC_ConstantDef *def)
{
	assert(def->Symbol == NULL);

	def->Symbol = DEFINING_CONST;	// avoid recursion
	ZCC_Expression *val = Simplify(def->Value);
	def->Value = val;
	PSymbolConst *sym = NULL;
	if (val->NodeType == AST_ExprConstant)
	{
		ZCC_ExprConstant *cval = static_cast<ZCC_ExprConstant *>(val);
		if (cval->Type == TypeString)
		{
			sym = new PSymbolConstString(def->NodeName, *(cval->StringVal));
		}
		else if (cval->Type->IsA(RUNTIME_CLASS(PInt)))
		{
			sym = new PSymbolConstNumeric(def->NodeName, cval->Type, cval->IntVal);
		}
		else if (cval->Type->IsA(RUNTIME_CLASS(PFloat)))
		{
			sym = new PSymbolConstNumeric(def->NodeName, cval->Type, cval->DoubleVal);
		}
		else
		{
			Error(def->Value, "Bad type for constant definiton");
		}
	}
	else
	{
		Error(def->Value, "Constant definition requires a constant value");
	}
	if (sym == NULL)
	{
		// Create a dummy constant so we don't make any undefined value warnings.
		sym = new PSymbolConstNumeric(def->NodeName, TypeError, 0);
	}
	def->Symbol = sym;
	Symbols->ReplaceSymbol(sym);
	return sym;
}